

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void highbd_update_mask1_avx2(__m256i *cmp_mask,int16_t *iscan_ptr,int *is_found,__m256i *mask)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RCX) [32];
  undefined4 *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i iscan;
  __m256i temp_mask;
  undefined1 local_160 [32];
  
  local_160 = ZEXT1632(ZEXT816(0));
  auVar1 = *in_RDI;
  if ((((((((((((((((((((((((((((((((auVar1 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   || (auVar1 >> 0xf & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                  (auVar1 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                 || (auVar1 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar1 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar1 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (auVar1 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (auVar1 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                            || (auVar1 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar1 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar1 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar1 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar1 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar1 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar1 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar1 >> 0x7f,0) != '\0') ||
                    (auVar1 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar1 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar1 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar1 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar1 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar1 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar1 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar1 >> 0xbf,0) != '\0') ||
            (auVar1 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar1 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar1 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar1 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar1 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
       (auVar1 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      (auVar1 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      *(long *)(*in_RDI + 0x18) < 0) {
    local_160 = vpand_avx2(*in_RDI,*in_RSI);
    *in_RDX = 1;
  }
  auVar1 = vpmaxsw_avx2(local_160,*in_RCX);
  *in_RCX = auVar1;
  return;
}

Assistant:

static inline void highbd_update_mask1_avx2(__m256i *cmp_mask,
                                            const int16_t *iscan_ptr,
                                            int *is_found, __m256i *mask) {
  __m256i temp_mask = _mm256_setzero_si256();
  if (_mm256_movemask_epi8(*cmp_mask)) {
    __m256i iscan = _mm256_loadu_si256((const __m256i *)(iscan_ptr));
    temp_mask = _mm256_and_si256(*cmp_mask, iscan);
    *is_found = 1;
  }
  *mask = _mm256_max_epi16(temp_mask, *mask);
}